

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void anon_unknown.dwarf_775ed::compute_BRIO_order_recursive
               (index_t nb_vertices,double *vertices,index_t dimension,index_t stride,
               vector<unsigned_int> *sorted_indices,iterator b,iterator e,index_t threshold,
               double ratio,index_t *depth,vector<unsigned_int> *levels)

{
  long lVar1;
  iterator iVar2;
  VertexMesh M;
  string local_a0;
  HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh> local_80;
  
  lVar1 = (long)e._M_current - (long)b._M_current >> 2;
  iVar2._M_current = b._M_current;
  if (threshold < (uint)lVar1) {
    *depth = *depth + 1;
    iVar2._M_current = b._M_current + (int)((double)lVar1 * ratio);
    compute_BRIO_order_recursive
              (nb_vertices,vertices,dimension,stride,sorted_indices,b,iVar2,threshold,ratio,depth,
               levels);
  }
  M.vertices.base_ = vertices;
  M.vertices.stride_ = stride;
  M.vertices.nb_vertices_ = nb_vertices;
  if (dimension == 2) {
    if (((long)e._M_current - (long)iVar2._M_current & 0x3fffffff8U) != 0) {
      (anonymous_namespace)::
      HilbertSort2d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::
      sort<0,false,false,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>>
                (&M,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                     )iVar2._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                  )e._M_current,0xfffffff8);
    }
  }
  else {
    if (dimension != 3) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,"");
      GEO::geo_should_not_have_reached(&local_a0,0x23f4);
    }
    HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::
    HilbertSort3d(&local_80,&M,iVar2,e,(index_t)sorted_indices);
  }
  if (levels != (vector<unsigned_int> *)0x0) {
    local_a0._M_dataplus._M_p._0_4_ =
         (uint)((ulong)((long)e._M_current -
                       (long)(sorted_indices->
                             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                             ).
                             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
    iVar2._M_current =
         (levels->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
         super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (levels->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::
      _M_realloc_insert<unsigned_int>
                (&levels->
                  super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
                 iVar2,(uint *)&local_a0);
    }
    else {
      *iVar2._M_current = (uint)local_a0._M_dataplus._M_p;
      (levels->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
      super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  return;
}

Assistant:

void compute_BRIO_order_recursive(
        index_t nb_vertices, const double* vertices,
        index_t dimension, index_t stride,
        vector<index_t>& sorted_indices,
        vector<index_t>::iterator b,
        vector<index_t>::iterator e,
        index_t threshold,
        double ratio,
        index_t& depth,
        vector<index_t>* levels
    ) {
        geo_debug_assert(e > b);

        vector<index_t>::iterator m = b;
        if(index_t(e - b) > threshold) {
            ++depth;
            m = b + int(double(e - b) * ratio);
            compute_BRIO_order_recursive(
                nb_vertices, vertices,
		dimension, stride,
                sorted_indices, b, m,
                threshold, ratio, depth,
                levels
            );
        }

        VertexMesh M(nb_vertices, vertices, stride);
	if(dimension == 3) {
	    HilbertSort3d<Hilbert_vcmp, VertexMesh>(
		M, m, e
	    );
	} else if(dimension ==2) {
	    HilbertSort2d<Hilbert_vcmp, VertexMesh>(
		M, m, e
	    );
	} else {
	    geo_assert_not_reached;
	}

        if(levels != nullptr) {
            levels->push_back(index_t(e - sorted_indices.begin()));
        }
    }